

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod>::operator=
          (CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> *this,
          CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> *other)

{
  IPCFrame_InvokeMethod *this_00;
  CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> *other_local;
  CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (IPCFrame_InvokeMethod *)operator_new(0x60);
  perfetto::protos::gen::IPCFrame_InvokeMethod::IPCFrame_InvokeMethod(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::IPCFrame_InvokeMethod,_std::default_delete<perfetto::protos::gen::IPCFrame_InvokeMethod>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }